

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1CompMaskPredTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1CompMaskPredTest_DISABLED_Speed_Test>
           *this)

{
  AV1CompMaskPredTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int,unsigned_char_const*,int,int),BLOCK_SIZE>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1CompMaskPredTest *)operator_new(0x48);
  anon_unknown.dwarf_180f112::AV1CompMaskPredTest::AV1CompMaskPredTest(this_00);
  (this_00->super_AV1CompMaskPredBase).super_Test._vptr_Test =
       (_func_int **)&PTR__AV1CompMaskPredTest_00f492d0;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__AV1CompMaskPredTest_DISABLED_Speed_Test_00f49310;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }